

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.h
# Opt level: O1

void __thiscall
Perseus::
PlanStartOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
          (Perseus *this,int iter,vector<double,_std::allocator<double>_> *VB,
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          *V)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pdVar2;
  pointer pcVar3;
  ostream oVar4;
  JointBeliefInterface *pJVar5;
  ostream *poVar6;
  pointer pvVar7;
  long lVar8;
  ulong uVar9;
  PlanningUnit *pu;
  PlanningUnitMADPDiscrete *this_00;
  ostream *poVar10;
  double dVar11;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  string resultsDir;
  stringstream valueFunctionFilename;
  string local_200;
  double local_1e0;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  undefined1 auVar13 [64];
  
  pdVar2 = (VB->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar8 = (long)(VB->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar8 == 0) {
    local_1e0 = 0.0;
  }
  else {
    local_1e0 = 0.0;
    uVar9 = 0;
    do {
      local_1e0 = local_1e0 + pdVar2[uVar9];
      uVar9 = uVar9 + 1;
    } while (lVar8 >> 3 != (uVar9 & 0xffffffff));
  }
  this_00 = *(PlanningUnitMADPDiscrete **)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               ((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
  }
  pJVar5 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(this_00);
  if (-2 < this->_m_verbose) {
    local_1b8._0_8_ = local_1b8 + 0x10;
    pcVar3 = (this->_m_identification)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,pcVar3,pcVar3 + (this->_m_identification)._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1b8._0_8_,local_1b8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": iteration ",0xc);
    *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 6;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iter);
    auVar13._8_56_ = extraout_var;
    auVar13._0_8_ = extraout_XMM1_Qa;
    auVar12 = auVar13._0_16_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," |V| ",5);
    for (pvVar7 = (V->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pvVar7 != (V->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
    }
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," sumV/nrB ",10);
    auVar12 = vcvtusi2sd_avx512f(auVar12,(long)(VB->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(VB->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data._M_start >> 3);
    poVar6 = std::ostream::_M_insert<double>(local_1e0 / auVar12._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," V0 ",4);
    dVar11 = BeliefValue::GetValue
                       ((BeliefInterface *)(&pJVar5->field_0x0 + *(long *)((long)*pJVar5 + -0xb8)),V
                       );
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (best ",7);
    poVar6 = std::ostream::_M_insert<double>(this->_m_bestValue);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  if (pJVar5 != (JointBeliefInterface *)0x0) {
    (**(code **)((long)*pJVar5 + 8))(pJVar5);
  }
  if ((this->_m_storeIntermediateValueFunctions == true) && (this->_m_dryrun == false)) {
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"POMDP","");
    pu = *(PlanningUnit **)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
    if (pu == (PlanningUnit *)0x0) {
      pu = *(PlanningUnit **)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
    }
    directories::MADPGetResultsDir(&local_1d8,(string *)local_1b8,pu);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1b8 + 0x10),local_1d8._M_dataplus._M_p,
                        local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/intermediate/",0xe);
    paVar1 = &local_200.field_2;
    pcVar3 = (this->_m_identification)._M_dataplus._M_p;
    local_200._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,pcVar3,pcVar3 + (this->_m_identification)._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"ValueFunction_h",0xf);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_iter_",6);
    lVar8 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar8 + -0x18) + 0x10) = 4;
    lVar8 = *(long *)(lVar8 + -0x18);
    poVar10 = poVar6 + lVar8;
    if (poVar6[lVar8 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar10);
      poVar10[0xe0] = oVar4;
      poVar10[0xe1] = (ostream)0x1;
    }
    poVar10[0xe0] = (ostream)0x30;
    std::ostream::operator<<((ostream *)poVar6,iter);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    AlphaVectorPlanning::ExportValueFunction(&local_200,V,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void PlanStartOfIteration(int iter,
                              const std::vector<double> &VB,
                              const VF &V) const
        {
            double x=0;
            for(unsigned int i=0;i!=VB.size();i++)
                x+=VB[i];
            JointBeliefInterface* jb0 = GetPU()->GetNewJointBeliefFromISD();
            if(GetVerbose() >= -1)
                std::cout 
                    << GetIdentification() << ": iteration " << std::setw(6)
                    << iter 
                    << " |V| " << GetSize(V)
                    << " sumV/nrB " << x/VB.size() << " V0 " 
                    << BeliefValue::GetValue( *jb0, V)
                    << " (best " << _m_bestValue << ")" << std::endl;
            delete jb0;

            if(_m_storeIntermediateValueFunctions && !_m_dryrun)
            {
                std::string resultsDir=directories::MADPGetResultsDir("POMDP",
                                                                 GetPU());
                std::stringstream valueFunctionFilename;
                valueFunctionFilename << resultsDir << "/intermediate/"
                                      << GetIdentification()
                                      << "ValueFunction_h"
                                      << GetPU()->GetHorizon() << "_iter_" 
                                      << std::setw(4) << std::setfill('0')
                                      << iter;
                AlphaVectorPlanning::
                    ExportValueFunction(valueFunctionFilename.str(),V);
            }
        }